

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswPairs.c
# Opt level: O3

Vec_Int_t ** Ssw_TransformPairsIntoTempClasses(Vec_Int_t *vPairs,int nObjNumMax)

{
  uint Entry;
  uint uVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  Vec_Int_t **ppVVar4;
  void *__s;
  uint *__src;
  Vec_Int_t *pVVar5;
  int *piVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  
  ppVVar4 = (Vec_Int_t **)calloc((long)nObjNumMax,8);
  __s = malloc((long)nObjNumMax * 4);
  if (0 < nObjNumMax) {
    memset(__s,0xff,(ulong)(uint)nObjNumMax << 2);
  }
  iVar3 = vPairs->nSize;
  if (iVar3 < 1) {
    if (__s == (void *)0x0) {
      return ppVVar4;
    }
  }
  else {
    uVar11 = 0;
    do {
      iVar10 = (int)uVar11;
      if (iVar3 <= (int)(iVar10 + 1U)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar3 = vPairs->pArray[iVar10 + 1U];
      lVar9 = (long)iVar3;
      if (lVar9 < 1) {
        __assert_fail("idObj > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswPairs.c"
                      ,0xa5,"Vec_Int_t **Ssw_TransformPairsIntoTempClasses(Vec_Int_t *, int)");
      }
      Entry = vPairs->pArray[uVar11];
      lVar7 = (long)(int)Entry;
      uVar1 = *(uint *)((long)__s + lVar7 * 4);
      if ((ulong)uVar1 == 0xffffffff) {
        uVar8 = *(uint *)((long)__s + lVar9 * 4);
        if (uVar8 != 0xffffffff) goto LAB_005ef14a;
        pVVar5 = (Vec_Int_t *)malloc(0x10);
        pVVar5->nCap = 0x10;
        pVVar5->nSize = 0;
        piVar6 = (int *)malloc(0x40);
        pVVar5->pArray = piVar6;
        ppVVar4[lVar7] = pVVar5;
        Vec_IntPush(pVVar5,Entry);
        Vec_IntPush(pVVar5,iVar3);
        *(uint *)((long)__s + lVar7 * 4) = Entry;
        *(uint *)((long)__s + lVar9 * 4) = Entry;
      }
      else {
        if (ppVVar4[(int)uVar1] == (Vec_Int_t *)0x0) {
          __assert_fail("(pReprs[idRepr] == -1) || (pvClasses[pReprs[idRepr]] != NULL)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswPairs.c"
                        ,0xa6,"Vec_Int_t **Ssw_TransformPairsIntoTempClasses(Vec_Int_t *, int)");
        }
        uVar8 = *(uint *)((long)__s + lVar9 * 4);
        if (uVar8 == 0xffffffff) {
          if (-1 < (int)uVar1) {
            Vec_IntPushUniqueOrder(ppVVar4[uVar1],iVar3);
            *(uint *)((long)__s + lVar9 * 4) = uVar1;
            goto LAB_005ef42a;
          }
          uVar8 = 0xffffffff;
        }
        else {
LAB_005ef14a:
          pVVar5 = ppVVar4[(int)uVar8];
          if (pVVar5 == (Vec_Int_t *)0x0) {
            __assert_fail("(pReprs[idObj] == -1) || (pvClasses[pReprs[idObj] ] != NULL)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswPairs.c"
                          ,0xa7,"Vec_Int_t **Ssw_TransformPairsIntoTempClasses(Vec_Int_t *, int)");
          }
          if ((uVar1 == 0xffffffff) && (-1 < (int)uVar8)) {
            if (uVar8 == Entry) {
              __assert_fail("idReprObj != idRepr",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswPairs.c"
                            ,0xbd,"Vec_Int_t **Ssw_TransformPairsIntoTempClasses(Vec_Int_t *, int)")
              ;
            }
            if ((int)uVar8 < (int)Entry) {
              Vec_IntPushUniqueOrder(pVVar5,Entry);
              *(uint *)((long)__s + lVar7 * 4) = uVar8;
            }
            else {
              uVar1 = pVVar5->nSize;
              uVar11 = (ulong)uVar1;
              if (uVar1 == pVVar5->nCap) {
                if ((int)uVar1 < 0x10) {
                  if (pVVar5->pArray == (int *)0x0) {
                    __src = (uint *)malloc(0x40);
                  }
                  else {
                    __src = (uint *)realloc(pVVar5->pArray,0x40);
                  }
                  pVVar5->pArray = (int *)__src;
                  iVar3 = 0x10;
                  if (__src == (uint *)0x0) {
LAB_005ef4fb:
                    __assert_fail("p->pArray",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                                  ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
                  }
                }
                else {
                  if (pVVar5->pArray == (int *)0x0) {
                    __src = (uint *)malloc(uVar11 * 8);
                  }
                  else {
                    __src = (uint *)realloc(pVVar5->pArray,uVar11 * 8);
                  }
                  pVVar5->pArray = (int *)__src;
                  if (__src == (uint *)0x0) goto LAB_005ef4fb;
                  iVar3 = uVar1 * 2;
                }
                pVVar5->nCap = iVar3;
                uVar11 = (ulong)(uint)pVVar5->nSize;
              }
              else {
                __src = (uint *)pVVar5->pArray;
              }
              pVVar5->nSize = (int)uVar11 + 1;
              if (0 < (int)uVar11) {
                memmove(__src + 1,__src,uVar11 << 2);
              }
              *__src = Entry;
              ppVVar4[lVar7] = pVVar5;
              ppVVar4[uVar8] = (Vec_Int_t *)0x0;
              iVar10 = ppVVar4[lVar7]->nSize;
              if ((long)iVar10 < 1) {
                iVar10 = 0;
              }
              else {
                piVar6 = ppVVar4[lVar7]->pArray;
                lVar9 = 0;
                do {
                  *(uint *)((long)__s + (long)piVar6[lVar9] * 4) = Entry;
                  lVar9 = lVar9 + 1;
                } while (iVar10 != lVar9);
              }
            }
            goto LAB_005ef42a;
          }
        }
        if (uVar1 != uVar8) {
          if ((int)uVar1 < (int)uVar8) {
            pVVar5 = ppVVar4[(int)uVar8];
            if (pVVar5->nSize < 1) {
              lVar9 = 0;
            }
            else {
              pVVar2 = ppVVar4[(int)uVar1];
              lVar9 = 0;
              do {
                iVar3 = pVVar5->pArray[lVar9];
                Vec_IntPushUniqueOrder(pVVar2,iVar3);
                *(uint *)((long)__s + (long)iVar3 * 4) = uVar1;
                lVar9 = lVar9 + 1;
              } while (lVar9 < pVVar5->nSize);
            }
            iVar10 = (int)lVar9;
            if (pVVar5->pArray != (int *)0x0) {
              free(pVVar5->pArray);
            }
            free(pVVar5);
            ppVVar4[(int)uVar8] = (Vec_Int_t *)0x0;
          }
          else {
            pVVar5 = ppVVar4[(int)uVar1];
            if (pVVar5->nSize < 1) {
              lVar9 = 0;
            }
            else {
              pVVar2 = ppVVar4[(int)uVar8];
              lVar9 = 0;
              do {
                iVar3 = pVVar5->pArray[lVar9];
                Vec_IntPushUniqueOrder(pVVar2,iVar3);
                *(uint *)((long)__s + (long)iVar3 * 4) = uVar8;
                lVar9 = lVar9 + 1;
              } while (lVar9 < pVVar5->nSize);
            }
            iVar10 = (int)lVar9;
            if (pVVar5->pArray != (int *)0x0) {
              free(pVVar5->pArray);
            }
            free(pVVar5);
            ppVVar4[(int)uVar1] = (Vec_Int_t *)0x0;
          }
        }
      }
LAB_005ef42a:
      uVar11 = (ulong)(iVar10 + 2U);
      iVar3 = vPairs->nSize;
    } while ((int)(iVar10 + 2U) < iVar3);
  }
  free(__s);
  return ppVVar4;
}

Assistant:

Vec_Int_t ** Ssw_TransformPairsIntoTempClasses( Vec_Int_t * vPairs, int nObjNumMax )
{
    Vec_Int_t ** pvClasses;   // vector of classes
    int * pReprs;             // mapping nodes into their representatives
    int Entry, idObj, idRepr, idReprObj, idReprRepr, i;
    // allocate data-structures
    pvClasses = ABC_CALLOC( Vec_Int_t *, nObjNumMax );
    pReprs    = ABC_ALLOC( int, nObjNumMax );
    for ( i = 0; i < nObjNumMax; i++ )
        pReprs[i] = -1;
    // consider pairs
    for ( i = 0; i < Vec_IntSize(vPairs); i += 2 )
    {
        // get both objects
        idRepr = Vec_IntEntry( vPairs, i   );
        idObj  = Vec_IntEntry( vPairs, i+1 );
        assert( idObj > 0 );
        assert( (pReprs[idRepr] == -1) || (pvClasses[pReprs[idRepr]] != NULL) );
        assert( (pReprs[idObj]  == -1) || (pvClasses[pReprs[idObj] ] != NULL) );
        // get representatives of both objects
        idReprRepr = pReprs[idRepr];
        idReprObj  = pReprs[idObj];
        // check different situations
        if ( idReprRepr == -1 && idReprObj == -1 )
        {   // they do not have classes
            // create a class
            pvClasses[idRepr] = Vec_IntAlloc( 4 );
            Vec_IntPush( pvClasses[idRepr], idRepr );
            Vec_IntPush( pvClasses[idRepr], idObj );
            pReprs[ idRepr ] = idRepr;
            pReprs[ idObj  ] = idRepr;
        }
        else if ( idReprRepr >= 0 && idReprObj == -1 )
        {   // representative has a class
            // add iObj to the same class
            Vec_IntPushUniqueOrder( pvClasses[idReprRepr], idObj );
            pReprs[ idObj ] = idReprRepr;
        }
        else if ( idReprRepr == -1 && idReprObj >= 0 )
        {   // object has a class
            assert( idReprObj != idRepr );
            if ( idReprObj < idRepr )
            { // add idRepr to the same class
                Vec_IntPushUniqueOrder( pvClasses[idReprObj], idRepr );
                pReprs[ idRepr ] = idReprObj;
            }
            else // if ( idReprObj > idRepr )
            { // make idRepr new representative
                Vec_IntPushFirst( pvClasses[idReprObj], idRepr );
                pvClasses[idRepr] = pvClasses[idReprObj];
                pvClasses[idReprObj] = NULL;
                // set correct representatives of each node
                Vec_IntForEachEntry( pvClasses[idRepr], Entry, i )
                    pReprs[ Entry ] = idRepr;
            }
        }
        else // if ( idReprRepr >= 0 && idReprObj >= 0 )
        {   // both have classes
            if ( idReprRepr == idReprObj )
            {  // the classes are the same
                // nothing to do
            }
            else
            {  // the classes are different
                // find the repr of the new class
                if ( idReprRepr < idReprObj )
                {
                    Vec_IntForEachEntry( pvClasses[idReprObj], Entry, i )
                    {
                        Vec_IntPushUniqueOrder( pvClasses[idReprRepr], Entry );
                        pReprs[ Entry ] = idReprRepr;
                    }
                    Vec_IntFree( pvClasses[idReprObj] );
                    pvClasses[idReprObj] = NULL;
                }
                else // if ( idReprRepr > idReprObj )
                {
                    Vec_IntForEachEntry( pvClasses[idReprRepr], Entry, i )
                    {
                        Vec_IntPushUniqueOrder( pvClasses[idReprObj], Entry );
                        pReprs[ Entry ] = idReprObj;
                    }
                    Vec_IntFree( pvClasses[idReprRepr] );
                    pvClasses[idReprRepr] = NULL;
                }
            }
        }
    }
    ABC_FREE( pReprs );
    return pvClasses;
}